

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomize_test.cxx
# Opt level: O2

void __thiscall string_randomize_test::test_method(string_randomize_test *this)

{
  string output;
  shared_count sStack_98;
  string input;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char **local_18;
  
  std::__cxx11::string::string((string *)&input,"overwrite",(allocator *)&output);
  std::__cxx11::string::string((string *)&output,(string *)&input);
  cryptox::randomize<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )output._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(output._M_dataplus._M_p + output._M_string_length));
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/detail/randomize_test.cxx"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x16);
  std::operator!=(&output,&input);
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_18 = &local_60;
  local_60 = "output != input";
  local_58 = "";
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_002b72c8;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_98);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(string_randomize_test) {
	const std::string input = "overwrite";
	std::string output = input;

	cryptox::randomize(output.begin(), output.end());
	BOOST_CHECK(output != input);
}